

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isCubeLevelCompareResultValid
               (TextureCubeView *texture,int levelNdx,Sampler *sampler,FilterMode filterMode,
               TexComparePrecision *prec,CubeFaceFloatCoords *coords,float cmpReference,float result
               )

{
  int *piVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  undefined1 auVar4 [16];
  TextureFormat TVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  CubeFaceFloatCoords *pCVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  ConstPixelBufferAccess **ppCVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  CubeFaceIntCoords CVar19;
  CubeFaceIntCoords CVar20;
  CubeFaceIntCoords CVar21;
  Vec2 uBounds;
  Vec2 vBounds;
  ConstPixelBufferAccess faces [6];
  Vec4 local_1f0;
  ConstPixelBufferAccess *local_1e0;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  ulong local_1c8;
  ConstPixelBufferAccess *local_1c0;
  ulong local_1b8;
  int local_1ac;
  uint local_1a8;
  uint local_1a4;
  float local_1a0;
  float local_19c;
  int local_198;
  int local_194;
  float local_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  uint uStack_180;
  uint uStack_17c;
  TexComparePrecision *local_178;
  Sampler *local_170;
  CubeFaceFloatCoords *local_168;
  Vec2 local_160;
  Vec2 local_158;
  float local_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [20];
  undefined8 uStack_114;
  undefined8 auStack_108 [27];
  
  if (filterMode == LINEAR) {
    if (sampler->seamlessCubeMap == true) {
      ppCVar14 = texture->m_levels;
      lVar11 = (long)levelNdx;
      local_1e0 = (ConstPixelBufferAccess *)lVar11;
      local_1a0 = cmpReference;
      local_19c = result;
      bVar10 = isFixedPointDepthTextureFormat(&texture->m_levels[0][lVar11].m_format);
      local_1c0 = (ConstPixelBufferAccess *)CONCAT71(local_1c0._1_7_,bVar10);
      iVar2 = texture->m_levels[coords->face][lVar11].m_size.m_data[0];
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_190,sampler->normalizedCoords,iVar2,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      local_194 = iVar2;
      local_170 = sampler;
      local_168 = coords;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_150,sampler->normalizedCoords,iVar2,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar17 = local_190 + -0.5;
      local_1d4 = fStack_18c + -0.5;
      local_1b8 = CONCAT44(local_1b8._4_4_,local_150 + -0.5);
      local_1d0 = fStack_14c + -0.5;
      lVar11 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)(local_128 + lVar11));
        lVar11 = lVar11 + 0x28;
      } while (lVar11 != 0xf0);
      local_188 = floorf(fVar17);
      fVar17 = floorf((float)local_1b8);
      local_1a8 = (uint)local_188;
      lVar11 = 0;
      do {
        pCVar3 = *ppCVar14;
        *(void **)(local_128 + lVar11 * 8 + 0x20) = pCVar3[(long)local_1e0].m_data;
        TVar5 = pCVar3[(long)local_1e0].m_format;
        uVar6 = *(undefined8 *)pCVar3[(long)local_1e0].m_size.m_data;
        piVar1 = pCVar3[(long)local_1e0].m_size.m_data + 2;
        uVar7 = *(undefined8 *)(piVar1 + 2);
        *(undefined8 *)(local_128 + (lVar11 * 2 + -1) * 4 + 0x14) = *(undefined8 *)piVar1;
        *(undefined8 *)(local_128 + (lVar11 * 2 + 1) * 4 + 0x14) = uVar7;
        *(TextureFormat *)(local_128 + (lVar11 * 2 + -2) * 4 + 8) = TVar5;
        *(undefined8 *)(local_128 + lVar11 * 8 + 8) = uVar6;
        lVar11 = lVar11 + 5;
        ppCVar14 = ppCVar14 + 1;
      } while (lVar11 != 0x1e);
      fVar15 = floorf(local_1d4);
      local_1e0 = (ConstPixelBufferAccess *)CONCAT44(local_1e0._4_4_,fVar15);
      fVar15 = floorf(local_1d0);
      local_1cc = (float)(int)fVar17;
      local_1ac = (int)fVar15;
      if (local_1ac < (int)local_1cc) {
        bVar10 = false;
      }
      else {
        local_198 = (int)local_1e0._0_4_;
        local_1a4 = (uint)(byte)local_1c0;
        local_178 = prec;
        do {
          local_1c8 = (ulong)(uint)local_1cc;
          local_148 = (float)(int)local_1cc;
          local_1cc = (float)((int)local_1cc + 1);
          uVar12 = (ulong)local_1a8;
          fStack_144 = local_148;
          fStack_140 = local_148;
          fStack_13c = local_148;
          while (pCVar9 = local_168, iVar2 = local_194, fVar17 = (float)uVar12,
                (int)fVar17 <= local_198) {
            local_1f0.m_data[0] = (float)local_168->face;
            fVar15 = (float)local_1c8;
            local_1f0.m_data[1] = fVar17;
            local_1f0.m_data[2] = fVar15;
            CVar19 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1f0,local_194);
            local_1d0 = (float)CVar19.t;
            local_1e0 = CVar19._0_8_;
            local_1f0.m_data[0] = (float)pCVar9->face;
            fVar13 = (float)((int)fVar17 + 1);
            local_1f0.m_data[1] = fVar13;
            local_1f0.m_data[2] = fVar15;
            CVar19 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1f0,iVar2);
            fVar15 = local_1cc;
            local_1d4 = (float)CVar19.t;
            local_1f0.m_data[0] = (float)pCVar9->face;
            local_1f0.m_data[2] = local_1cc;
            local_1f0.m_data[1] = fVar17;
            CVar20 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1f0,iVar2);
            local_1f0.m_data[0] = (float)pCVar9->face;
            local_1f0.m_data[2] = fVar15;
            local_1f0.m_data[1] = fVar13;
            CVar21 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_1f0,iVar2);
            uVar12 = (ulong)local_1e0 & 0xffffffff;
            if (uVar12 == 6) {
              return true;
            }
            if (CVar20.face == CUBEFACE_LAST) {
              return true;
            }
            if (CVar19.face == CUBEFACE_LAST) {
              return true;
            }
            if (CVar21.face == CUBEFACE_LAST) {
              return true;
            }
            fVar17 = (float)(int)fVar17;
            local_1c0 = (ConstPixelBufferAccess *)(local_128 + (CVar19._0_8_ & 0xffffffff) * 0x28);
            fVar15 = (local_190 + -0.5) - fVar17;
            fVar18 = (fStack_18c + -0.5) - fVar17;
            auVar16._4_4_ = fVar18;
            auVar16._0_4_ = fVar15;
            auVar16._8_4_ = 0.0 - fVar17;
            auVar16._12_4_ = 0.0 - fVar17;
            auVar16 = minps(_DAT_00ad7f10,auVar16);
            local_188 = (float)(-(uint)(0.0 <= fVar15) & auVar16._0_4_);
            fStack_184 = (float)(-(uint)(0.0 <= fVar18) & auVar16._4_4_);
            uStack_180 = -(uint)(0.0 <= 0.0 - fVar17) & auVar16._8_4_;
            uStack_17c = -(uint)(0.0 <= 0.0 - fVar17) & auVar16._12_4_;
            fVar17 = (local_150 + -0.5) - local_148;
            fVar15 = (fStack_14c + -0.5) - fStack_144;
            auVar4._4_4_ = fVar15;
            auVar4._0_4_ = fVar17;
            auVar4._8_4_ = 0.0 - fStack_140;
            auVar4._12_4_ = 0.0 - fStack_13c;
            auVar16 = minps(_DAT_00ad7f10,auVar4);
            local_138 = (float)(-(uint)(0.0 <= fVar17) & auVar16._0_4_);
            fStack_134 = (float)(-(uint)(0.0 <= fVar15) & auVar16._4_4_);
            uStack_130 = -(uint)(0.0 <= 0.0 - fStack_140) & auVar16._8_4_;
            uStack_12c = -(uint)(0.0 <= 0.0 - fStack_13c) & auVar16._12_4_;
            uVar8 = (ulong)local_1e0 >> 0x20;
            local_1e0 = (ConstPixelBufferAccess *)(local_128 + (CVar20._0_8_ & 0xffffffff) * 0x28);
            local_1b8 = (ulong)(uint)fVar13;
            local_1f0.m_data[0] =
                 ConstPixelBufferAccess::getPixDepth
                           ((ConstPixelBufferAccess *)(local_128 + uVar12 * 0x28),(int)uVar8,
                            (int)local_1d0,0);
            local_1f0.m_data[1] =
                 ConstPixelBufferAccess::getPixDepth(local_1c0,CVar19.s,(int)local_1d4,0);
            local_1f0.m_data[2] = ConstPixelBufferAccess::getPixDepth(local_1e0,CVar20.s,CVar20.t,0)
            ;
            local_1f0.m_data[3] =
                 ConstPixelBufferAccess::getPixDepth
                           ((ConstPixelBufferAccess *)
                            (local_128 + (CVar21._0_8_ & 0xffffffff) * 0x28),CVar21.s,CVar21.t,0);
            local_158.m_data[1] = fStack_184;
            local_158.m_data[0] = local_188;
            local_160.m_data[1] = fStack_134;
            local_160.m_data[0] = local_138;
            bVar10 = isBilinearCompareValid
                               (local_170->compare,local_178,&local_1f0,&local_158,&local_160,
                                local_1a0,local_19c,SUB41(local_1a4,0));
            uVar12 = local_1b8;
            if (bVar10) {
              return true;
            }
          }
          bVar10 = false;
        } while ((int)local_1cc <= local_1ac);
      }
    }
    else {
      local_128._0_4_ = coords->s;
      local_128._4_4_ = coords->t;
      bVar10 = isLinearCompareResultValid
                         (texture->m_levels[coords->face] + levelNdx,sampler,prec,(Vec2 *)local_128,
                          0,cmpReference,result);
    }
  }
  else {
    local_128._0_4_ = coords->s;
    local_128._4_4_ = coords->t;
    bVar10 = isNearestCompareResultValid
                       (texture->m_levels[coords->face] + levelNdx,sampler,prec,(Vec2 *)local_128,0,
                        cmpReference,result);
  }
  return bVar10;
}

Assistant:

static bool isCubeLevelCompareResultValid (const TextureCubeView&			texture,
										   const int						levelNdx,
										   const Sampler&					sampler,
										   const Sampler::FilterMode		filterMode,
										   const TexComparePrecision&		prec,
										   const CubeFaceFloatCoords&		coords,
										   const float						cmpReference,
										   const float						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearCompareResultValid(texture, levelNdx, sampler, prec, coords, cmpReference, result);
		else
			return isLinearCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
	}
	else
		return isNearestCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
}